

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logging.cc
# Opt level: O2

void __thiscall
muduo::Logger::Impl::Impl(Impl *this,LogLevel level,int savedErrno,SourceFile *file,int line)

{
  int iVar1;
  undefined4 uVar2;
  Timestamp TVar3;
  char *str;
  self *psVar4;
  LogStream *pLVar5;
  int *in_FS_OFFSET;
  
  TVar3 = Timestamp::now();
  (this->time_).microSecondsSinceEpoch_ = TVar3.microSecondsSinceEpoch_;
  pLVar5 = &this->stream_;
  memset(pLVar5,0,0xfb0);
  (this->stream_).buffer_.cur_ = (this->stream_).buffer_.data_;
  (this->stream_).buffer_.cookie_ = detail::FixedBuffer<4000>::cookieStart;
  this->level_ = level;
  this->line_ = line;
  iVar1 = file->size_;
  uVar2 = *(undefined4 *)&file->field_0xc;
  (this->basename_).data_ = file->data_;
  (this->basename_).size_ = iVar1;
  *(undefined4 *)&(this->basename_).field_0xc = uVar2;
  formatTime(this);
  CurrentThread::tid();
  LogStream::append(pLVar5,*(char **)in_FS_OFFSET,*in_FS_OFFSET);
  LogStream::append(pLVar5,*(char **)(LogLevelName + (ulong)level * 8),6);
  if (savedErrno != 0) {
    str = strerror_tl(savedErrno);
    psVar4 = LogStream::operator<<(pLVar5,str);
    psVar4 = LogStream::operator<<(psVar4," (errno=");
    pLVar5 = LogStream::operator<<(psVar4,savedErrno);
    LogStream::operator<<(pLVar5,") ");
  }
  return;
}

Assistant:

Logger::Impl::Impl(LogLevel level, int savedErrno, const SourceFile& file, int line)
  : time_(Timestamp::now()),
    stream_(),
    level_(level),
    line_(line),
    basename_(file)
{
  formatTime();
  CurrentThread::tid();
  stream_ << T(CurrentThread::tidString(), CurrentThread::tidStringLength());
  stream_ << T(LogLevelName[level], 6);
  if (savedErrno != 0)
  {
    stream_ << strerror_tl(savedErrno) << " (errno=" << savedErrno << ") ";
  }
}